

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::TestCheckRewriteString(char *regexp,char *rewrite,bool expect_ok)

{
  ostream *poVar1;
  bool bVar2;
  size_t sVar3;
  string error;
  RE2 exp;
  string local_2a0;
  LogMessage local_280;
  RE2 local_100;
  
  local_2a0._M_string_length = 0;
  local_2a0.field_2._M_local_buf[0] = '\0';
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  RE2::RE2(&local_100,regexp);
  local_280._0_8_ = rewrite;
  if (rewrite == (char *)0x0) {
    local_280._8_4_ = 0;
  }
  else {
    sVar3 = strlen(rewrite);
    local_280._8_4_ = SUB84(sVar3,0);
  }
  bVar2 = RE2::CheckRewriteString(&local_100,(StringPiece *)&local_280,&local_2a0);
  if (bVar2 != expect_ok) {
    LogMessage::LogMessage
              (&local_280,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xc2,3);
    poVar1 = (ostream *)((long)&local_280 + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"Check failed: (expect_ok) == (actual_ok)",0x28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," for ",5);
    if (rewrite == (char *)0x0) {
      std::ios::clear((int)poVar1 +
                      (int)*(undefined8 *)(CONCAT44(local_280._12_4_,local_280._8_4_) + -0x18));
    }
    else {
      sVar3 = strlen(rewrite);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,rewrite,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," error: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_280);
  }
  RE2::~RE2(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void TestCheckRewriteString(const char* regexp, const char* rewrite,
                              bool expect_ok) {
  string error;
  RE2 exp(regexp);
  bool actual_ok = exp.CheckRewriteString(rewrite, &error);
  EXPECT_EQ(expect_ok, actual_ok) << " for " << rewrite << " error: " << error;
}